

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

bool __thiscall QHttp2Stream::sendRST_STREAM(QHttp2Stream *this,Http2Error errorCode)

{
  FrameWriter *this_00;
  undefined1 uVar1;
  int __fd;
  QHttp2Connection *this_01;
  undefined8 uVar2;
  long lVar3;
  ssize_t sVar4;
  size_t __n;
  void *__buf;
  long in_FS_OFFSET;
  uint local_48;
  uchar local_44 [20];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  if ((*(int *)(this + 0x68) != 0) && (*(int *)(this + 0x68) != 5)) {
    if (this[0x24] == (QHttp2Stream)0x0) {
      this_01 = (QHttp2Connection *)
                QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
      QHttp2Connection::registerStreamAsResetLocally(this_01,*(quint32 *)(this + 0x10));
      *(Http2Error *)(this + 0x28) = errorCode;
      if (this[0x2c] == (QHttp2Stream)0x0) {
        this[0x2c] = (QHttp2Stream)0x1;
      }
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_48 = 2;
        local_44[0] = '\0';
        local_44[1] = '\0';
        local_44[2] = '\0';
        local_44[3] = '\0';
        local_44[4] = '\0';
        local_44[5] = '\0';
        local_44[6] = '\0';
        local_44[7] = '\0';
        local_44[8] = '\0';
        local_44[9] = '\0';
        local_44[10] = '\0';
        local_44[0xb] = '\0';
        local_44[0xc] = '\0';
        local_44[0xd] = '\0';
        local_44[0xe] = '\0';
        local_44[0xf] = '\0';
        local_44[0x10] = '\0';
        local_44[0x11] = '\0';
        local_44[0x12] = '\0';
        local_44[0x13] = '\0';
        local_30 = qHttp2ConnectionLog::category.name;
        uVar2 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
        QMessageLogger::debug
                  ((char *)&local_48,"[%p] sending RST_STREAM on stream %u, code: %u",uVar2,
                   (ulong)*(uint *)(this + 0x10),errorCode);
      }
      transitionState(this,RST);
      lVar3 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
      this_00 = (FrameWriter *)(lVar3 + 0x250);
      __n = (size_t)*(uint *)(this + 0x10);
      Http2::FrameWriter::start(this_00,RST_STREAM,(FrameFlags)0x0,*(uint *)(this + 0x10));
      local_48 = errorCode >> 0x18 | (errorCode & 0xff0000) >> 8 | (errorCode & 0xff00) << 8 |
                 errorCode << 0x18;
      Http2::FrameWriter::append(this_00,(uchar *)&local_48,local_44);
      __fd = QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
      sVar4 = Http2::FrameWriter::write(this_00,__fd,__buf,__n);
      uVar1 = (undefined1)sVar4;
    }
    else {
      uVar1 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Stream::sendRST_STREAM(Http2::Http2Error errorCode)
{
    if (m_state == State::Closed || m_state == State::Idle)
        return false;
    // Never respond to a RST_STREAM with a RST_STREAM or looping might occur.
    if (m_RST_STREAM_received.has_value())
        return false;

    getConnection()->registerStreamAsResetLocally(streamID());

    m_RST_STREAM_sent = errorCode;
    qCDebug(qHttp2ConnectionLog, "[%p] sending RST_STREAM on stream %u, code: %u", getConnection(),
            m_streamID, errorCode);
    transitionState(StateTransition::RST);

    QHttp2Connection *connection = getConnection();
    FrameWriter &frameWriter = connection->frameWriter;
    frameWriter.start(FrameType::RST_STREAM, FrameFlag::EMPTY, m_streamID);
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*connection->getSocket());
}